

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# popthelp.c
# Opt level: O2

size_t itemUsage(FILE *fp,columns_t columns,poptItem item,wchar_t nitems,char *translation_domain)

{
  uint uVar1;
  size_t sVar2;
  wchar_t wVar3;
  poptOption *opt;
  
  if (item != (poptItem)0x0) {
    wVar3 = L'\0';
    if (L'\0' < nitems) {
      wVar3 = nitems;
    }
    while (wVar3 != L'\0') {
      uVar1 = (item->option).argInfo;
      if ((_poptArgMask & uVar1) != 6) {
        if ((item->option).longName == (char *)0x0) {
          if (((uVar1 >> 0x1e & 1) == 0) && ((item->option).shortName != '\0')) goto LAB_001063e1;
        }
        else if ((uVar1 >> 0x1e & 1) == 0) {
LAB_001063e1:
          sVar2 = singleOptionUsage(fp,columns,&item->option,(char *)(ulong)(_poptArgMask & uVar1));
          columns->cur = sVar2;
        }
      }
      item = item + 1;
      wVar3 = wVar3 + L'\xffffffff';
    }
  }
  return columns->cur;
}

Assistant:

static size_t itemUsage(FILE * fp, columns_t columns,
		poptItem item, int nitems,
		const char * translation_domain)
{
    int i;

    if (item != NULL)
    for (i = 0; i < nitems; i++, item++) {
	const struct poptOption * opt;
	opt = &item->option;
        if (poptArgType(opt) == POPT_ARG_INTL_DOMAIN) {
	    translation_domain = (const char *)opt->arg;
	} else
	if ((opt->longName || opt->shortName) && !F_ISSET(opt, DOC_HIDDEN)) {
	    columns->cur = singleOptionUsage(fp, columns, opt, translation_domain);
	}
    }

    return columns->cur;
}